

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qparallelanimationgroup.cpp
# Opt level: O1

void __thiscall
QParallelAnimationGroupPrivate::connectUncontrolledAnimations(QParallelAnimationGroupPrivate *this)

{
  long lVar1;
  QAbstractAnimation **ppQVar2;
  Entry *pEVar3;
  int iVar4;
  long lVar5;
  long in_FS_OFFSET;
  QAbstractAnimation *animation;
  sockaddr *local_58;
  TryEmplaceResult local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = (this->super_QAnimationGroupPrivate).animations.d.size;
  if (lVar1 != 0) {
    ppQVar2 = (this->super_QAnimationGroupPrivate).animations.d.ptr;
    lVar5 = 0;
    do {
      local_58 = *(sockaddr **)((long)ppQVar2 + lVar5);
      iVar4 = (**(code **)(*(long *)local_58 + 0x60))();
      if (iVar4 == -1) {
LAB_003b402f:
        QHash<QAbstractAnimation*,int>::tryEmplace_impl<QAbstractAnimation*const&>
                  (&local_50,(QHash<QAbstractAnimation*,int> *)&this->uncontrolledFinishTime,
                   (QAbstractAnimation **)&local_58);
        pEVar3 = (local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].entries +
                 (local_50.iterator.i.d)->spans[local_50.iterator.i.bucket >> 7].offsets
                 [(uint)local_50.iterator.i.bucket & 0x7f];
        (pEVar3->storage).data[8] = 0xff;
        (pEVar3->storage).data[9] = 0xff;
        (pEVar3->storage).data[10] = 0xff;
        (pEVar3->storage).data[0xb] = 0xff;
        QObject::connect((int)&local_50,local_58,0x591a2f);
        QMetaObject::Connection::~Connection((Connection *)&local_50);
      }
      else {
        iVar4 = QAbstractAnimation::loopCount((QAbstractAnimation *)local_58);
        if (iVar4 < 0) goto LAB_003b402f;
      }
      lVar5 = lVar5 + 8;
    } while (lVar1 << 3 != lVar5);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QParallelAnimationGroupPrivate::connectUncontrolledAnimations()
{
    for (AnimationListConstIt it = animations.constBegin(), cend = animations.constEnd(); it != cend; ++it) {
        QAbstractAnimation *animation = *it;
        if (animation->duration() == -1 || animation->loopCount() < 0) {
            uncontrolledFinishTime[animation] = -1;
            connectUncontrolledAnimation(animation);
        }
    }
}